

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O3

CURLcode tftp_multi_statemach(Curl_easy *data,_Bool *done)

{
  ulong uVar1;
  tftp_state_data *state_00;
  tftp_state_data *state_01;
  Curl_easy *data_00;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  int iVar4;
  tftp_event_t tVar5;
  timediff_t tVar6;
  time_t tVar7;
  int *piVar8;
  char *pcVar9;
  ssize_t sVar10;
  ushort *puVar11;
  void *pvVar12;
  long size;
  size_t sVar13;
  undefined8 uVar14;
  ulong uVar15;
  size_t sVar16;
  ushort *puVar17;
  tftp_state_data *state;
  ulong uVar18;
  bool bVar19;
  char buffer [256];
  socklen_t local_138 [66];
  
  state_00 = (data->conn->proto).tftpc;
  tVar6 = Curl_timeleft(state_00->data,(curltime *)0x0,state_00->state == TFTP_STATE_START);
  if (tVar6 < 0) {
    state_00->error = TFTP_ERR_TIMEOUT;
    state_00->state = TFTP_STATE_FIN;
  }
  else {
    tVar7 = time((time_t *)0x0);
    if ((long)state_00->retry_time + state_00->rx_time < tVar7) {
      tVar7 = time((time_t *)0x0);
      state_00->rx_time = tVar7;
      *done = false;
      CVar3 = tftp_state_machine(state_00,TFTP_EVENT_TIMEOUT);
      goto joined_r0x0015aae6;
    }
  }
  *done = false;
  iVar4 = Curl_socket_check(state_00->sockfd,-1,-1,0);
  if (iVar4 == 0) {
    return CURLE_OK;
  }
  if (iVar4 == -1) {
    piVar8 = __errno_location();
    pcVar9 = Curl_strerror(*piVar8,(char *)local_138,0x100);
    Curl_failf(data,"%s",pcVar9);
    state_00->event = TFTP_EVENT_ERROR;
    return CURLE_OK;
  }
  state_01 = (data->conn->proto).tftpc;
  local_138[0] = 0x80;
  sVar10 = recvfrom(state_01->sockfd,(state_01->rpacket).data,(long)state_01->blksize + 4,0,
                    (sockaddr *)&state_01->remote_addr,local_138);
  iVar4 = (int)sVar10;
  state_01->rbytes = iVar4;
  state_01->remote_addrlen = local_138[0];
  if (iVar4 < 4) {
    Curl_failf(data,"Received too short packet");
    state_01->event = TFTP_EVENT_TIMEOUT;
  }
  else {
    puVar17 = (ushort *)(state_01->rpacket).data;
    tVar5 = (tftp_event_t)(ushort)(*puVar17 << 8 | *puVar17 >> 8);
    state_01->event = tVar5;
    switch(tVar5) {
    case TFTP_EVENT_DATA:
      if (((iVar4 != 4) &&
          ((ushort)((short)*(undefined4 *)&state_01->block + 1U) ==
           (ushort)(puVar17[1] << 8 | puVar17[1] >> 8))) &&
         (CVar3 = Curl_client_write(data,1,(char *)(puVar17 + 2),(ulong)(iVar4 - 4)),
         CVar3 != CURLE_OK)) {
        tftp_state_machine(state_01,TFTP_EVENT_ERROR);
        return CVar3;
      }
      break;
    case TFTP_EVENT_ACK:
      break;
    case TFTP_EVENT_ERROR:
      puVar11 = puVar17 + 2;
      state_01->error = (uint)(ushort)(puVar17[1] << 8 | puVar17[1] >> 8);
      pvVar12 = memchr(puVar11,0,(ulong)(iVar4 - 4));
      if ((((pvVar12 != (void *)0x0) &&
           ((ulong)((long)pvVar12 - (long)puVar11) < (ulong)(iVar4 - 4))) &&
          (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"TFTP error: %s",puVar11);
      }
      break;
    case TFTP_EVENT_OACK:
      data_00 = state_01->data;
      state_01->blksize = 0x200;
      puVar11 = (ushort *)((long)puVar17 + (ulong)(iVar4 - 2) + 2);
      puVar17 = puVar17 + 1;
      do {
        uVar18 = (long)puVar11 - (long)puVar17;
        pvVar12 = memchr(puVar17,0,uVar18);
        uVar15 = (long)pvVar12 - (long)puVar17;
        if (pvVar12 == (void *)0x0) {
          uVar15 = uVar18;
        }
        uVar1 = uVar15 + 1;
        sVar16 = uVar18 - uVar1;
        if (uVar18 < uVar1 || sVar16 == 0) {
LAB_0015ab18:
          pcVar9 = "Malformed ACK packet, rejecting";
LAB_0015ab28:
          Curl_failf(data_00,pcVar9);
          return CURLE_TFTP_ILLEGAL;
        }
        pvVar12 = memchr((void *)(uVar1 + (long)puVar17),0,sVar16);
        sVar13 = (long)pvVar12 - (long)(uVar1 + (long)puVar17);
        if (pvVar12 == (void *)0x0) {
          sVar13 = sVar16;
        }
        uVar15 = uVar15 + sVar13 + 2;
        if (uVar18 < uVar15) goto LAB_0015ab18;
        sVar16 = strlen((char *)puVar17);
        pcVar9 = (char *)((long)puVar17 + sVar16 + 1);
        if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar2 = (data_00->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
            (0 < pcVar2->log_level)))) {
          Curl_infof(data_00,"got option=(%s) value=(%s)",puVar17,pcVar9);
        }
        iVar4 = curl_strnequal((char *)puVar17,"blksize",7);
        if (iVar4 == 0) {
          iVar4 = curl_strnequal((char *)puVar17,"tsize",5);
          if (iVar4 != 0) {
            size = strtol(pcVar9,(char **)0x0,10);
            if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar2 = (data_00->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                (0 < pcVar2->log_level)))) {
              Curl_infof(data_00,"%s (%ld)","tsize parsed from OACK",size);
            }
            if (((data_00->state).field_0x776 & 2) == 0) {
              if (size == 0) {
                Curl_failf(data_00,"invalid tsize -:%s:- value in OACK packet",pcVar9);
                return CURLE_TFTP_ILLEGAL;
              }
              Curl_pgrsSetDownloadSize(data_00,size);
            }
          }
        }
        else {
          uVar18 = strtol(pcVar9,(char **)0x0,10);
          if (uVar18 == 0) {
            pcVar9 = "invalid blocksize value in OACK packet";
            goto LAB_0015ab28;
          }
          if (0xffb8 < (long)uVar18) {
            pcVar9 = "blksize is larger than max supported";
            uVar14 = 0xffb8;
LAB_0015ab65:
            Curl_failf(data_00,"%s (%d)",pcVar9,uVar14);
            return CURLE_TFTP_ILLEGAL;
          }
          if ((long)uVar18 < 8) {
            pcVar9 = "blksize is smaller than min supported";
            uVar14 = 8;
            goto LAB_0015ab65;
          }
          if ((long)state_01->requested_blksize < (long)uVar18) {
            Curl_failf(data_00,"%s (%ld)","server requested blksize larger than allocated",uVar18);
            return CURLE_TFTP_ILLEGAL;
          }
          state_01->blksize = (int)uVar18;
          if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar2 = (data_00->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
              (0 < pcVar2->log_level)))) {
            Curl_infof(data_00,"%s (%d) %s (%d)","blksize parsed from OACK",uVar18 & 0xffffffff,
                       "requested");
          }
        }
        puVar17 = (ushort *)((long)puVar17 + uVar15);
      } while (puVar17 < puVar11);
      break;
    default:
      Curl_failf(data,"%s","Internal error: Unexpected packet");
    }
    iVar4 = Curl_pgrsUpdate(data);
    if (iVar4 != 0) {
      tftp_state_machine(state_01,TFTP_EVENT_ERROR);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  CVar3 = tftp_state_machine(state_00,state_00->event);
joined_r0x0015aae6:
  if (CVar3 == CURLE_OK) {
    CVar3 = CURLE_OK;
    bVar19 = state_00->state == TFTP_STATE_FIN;
    *done = bVar19;
    if (bVar19) {
      Curl_xfer_setup_nop(data);
    }
  }
  return CVar3;
}

Assistant:

static CURLcode tftp_multi_statemach(struct Curl_easy *data, bool *done)
{
  tftp_event_t event;
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct tftp_state_data *state = conn->proto.tftpc;
  timediff_t timeout_ms = tftp_state_timeout(data, &event);

  *done = FALSE;

  if(timeout_ms < 0) {
    failf(data, "TFTP response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  if(event != TFTP_EVENT_NONE) {
    result = tftp_state_machine(state, event);
    if(result)
      return result;
    *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
    if(*done)
      /* Tell curl we are done */
      Curl_xfer_setup_nop(data);
  }
  else {
    /* no timeouts to handle, check our socket */
    int rc = SOCKET_READABLE(state->sockfd, 0);

    if(rc == -1) {
      /* bail out */
      int error = SOCKERRNO;
      char buffer[STRERROR_LEN];
      failf(data, "%s", Curl_strerror(error, buffer, sizeof(buffer)));
      state->event = TFTP_EVENT_ERROR;
    }
    else if(rc) {
      result = tftp_receive_packet(data);
      if(result)
        return result;
      result = tftp_state_machine(state, state->event);
      if(result)
        return result;
      *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
      if(*done)
        /* Tell curl we are done */
        Curl_xfer_setup_nop(data);
    }
    /* if rc == 0, then select() timed out */
  }

  return result;
}